

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O3

void __thiscall QEvdevTouchScreenData::assignIds(QEvdevTouchScreenData *this)

{
  Span *pSVar1;
  Entry *pEVar2;
  const_iterator it;
  bool bVar3;
  int iVar4;
  QEvdevTouchScreenData *pQVar5;
  ulong uVar6;
  Contact *args;
  Data *pDVar7;
  Data *pDVar8;
  uint uVar9;
  undefined1 auVar10 [8];
  QEvdevTouchScreenData *pQVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  int bestId;
  int dist;
  QEvdevTouchScreenData *local_80;
  Data *local_78;
  int local_5c;
  QHash<int,_QEvdevTouchScreenData::Contact> local_58;
  undefined1 local_50 [8];
  QHash<int,_QEvdevTouchScreenData::Contact> local_48;
  int local_3c;
  TouchPoint *local_38;
  
  local_38 = *(TouchPoint **)(in_FS_OFFSET + 0x28);
  local_48.d = (this->m_lastContacts).d;
  if ((local_48.d != (Data *)0x0) &&
     (((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  auVar10 = (undefined1  [8])(this->m_contacts).d;
  local_50 = auVar10;
  if (auVar10 == (undefined1  [8])0x0) {
LAB_00128083:
    local_58.d = (Data *)0x0;
    iVar12 = -1;
  }
  else {
    if ((((RefCount *)&((QEvdevTouchScreenData *)auVar10)->q)->atomic)._q_value.
        super___atomic_base<int>._M_i != -1) {
      LOCK();
      (((RefCount *)&((QEvdevTouchScreenData *)auVar10)->q)->atomic)._q_value.
      super___atomic_base<int>._M_i =
           (((RefCount *)&((QEvdevTouchScreenData *)auVar10)->q)->atomic)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (auVar10 == (undefined1  [8])0x0) goto LAB_00128083;
    }
    local_58.d = (Data *)0x0;
    iVar12 = -1;
    local_78 = (Data *)0x0;
    local_80 = (QEvdevTouchScreenData *)0x0;
    pQVar11 = (QEvdevTouchScreenData *)&this->m_contacts;
    do {
      if (*(long *)&((QEvdevTouchScreenData *)auVar10)->m_lastEventType == 0) {
LAB_00128300:
        bVar3 = false;
        goto LAB_00128302;
      }
      if (local_48.d == (Data *)0x0) goto LAB_00128323;
      if ((local_48.d)->size == 0) goto LAB_00128300;
      local_5c = 0;
      pQVar5 = (QEvdevTouchScreenData *)auVar10;
      if (1 < *(uint *)&((QEvdevTouchScreenData *)auVar10)->q) {
        pQVar5 = (QEvdevTouchScreenData *)
                 QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::
                 detached((Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)auVar10)
        ;
        pQVar11 = (QEvdevTouchScreenData *)auVar10;
        local_50 = (undefined1  [8])pQVar5;
      }
      pSVar1 = (Span *)(pQVar5->m_touchPoints).d.size;
      auVar10 = (undefined1  [8])pQVar5;
      if (pSVar1->offsets[0] == 0xff) {
        pDVar7 = (Data *)0x1;
        do {
          pDVar8 = pDVar7;
          if ((pQVar5->m_touchPoints).d.d == pDVar8) {
            pDVar8 = (Data *)0x0;
            pQVar5 = (QEvdevTouchScreenData *)0x0;
            break;
          }
          pDVar7 = (Data *)((long)&(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>
                                   ._M_i + 1);
        } while (pSVar1[(ulong)pDVar8 >> 7].offsets[(uint)pDVar8 & 0x7f] == 0xff);
        if ((pDVar8 != (Data *)0x0) || (pQVar5 != (QEvdevTouchScreenData *)0x0)) goto LAB_00128119;
      }
      else {
        pDVar8 = (Data *)0x0;
LAB_00128119:
        iVar13 = -1;
        do {
          local_3c = -0x55555556;
          pSVar1 = (Span *)(pQVar5->m_touchPoints).d.size;
          iVar4 = findClosestContact(pQVar11,&local_48,
                                     *(int *)(pSVar1[(ulong)pDVar8 >> 7].entries
                                              [pSVar1[(ulong)pDVar8 >> 7].offsets
                                               [(uint)pDVar8 & 0x7f]].storage.data + 8),
                                     *(int *)(pSVar1[(ulong)pDVar8 >> 7].entries
                                              [pSVar1[(ulong)pDVar8 >> 7].offsets
                                               [(uint)pDVar8 & 0x7f]].storage.data + 0xc),&local_3c)
          ;
          if ((-1 < iVar4) && (local_3c < iVar13 || iVar13 == -1)) {
            iVar13 = local_3c;
            local_80 = pQVar5;
            local_78 = pDVar8;
            local_5c = iVar4;
          }
          do {
            if ((Data *)((long)&(pQVar5->m_touchPoints).d.d[-1].super_QArrayData.alloc + 7U) ==
                pDVar8) {
              pDVar8 = (Data *)0x0;
              pQVar5 = (QEvdevTouchScreenData *)0x0;
              break;
            }
            pDVar8 = (Data *)((long)&(pDVar8->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int>._M_i + 1);
          } while (pSVar1[(ulong)pDVar8 >> 7].offsets[(uint)pDVar8 & 0x7f] == 0xff);
        } while ((pDVar8 != (Data *)0x0) || (pQVar5 != (QEvdevTouchScreenData *)0x0));
        if (-1 < iVar13) {
          pSVar1 = (Span *)(local_80->m_touchPoints).d.size;
          it.i.bucket = (size_t)local_78;
          it.i.d = (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)local_80;
          uVar6 = (ulong)local_78 >> 7;
          uVar9 = (uint)local_78 & 0x7f;
          pEVar2 = pSVar1[uVar6].entries;
          *(int *)(pEVar2[pSVar1[uVar6].offsets[uVar9]].storage.data + 4) = local_5c;
          local_3c = local_5c;
          QHash<int,QEvdevTouchScreenData::Contact>::emplace<QEvdevTouchScreenData::Contact_const&>
                    ((QHash<int,QEvdevTouchScreenData::Contact> *)&local_58,&local_3c,
                     (Contact *)(pEVar2[pSVar1[uVar6].offsets[uVar9]].storage.data + 4));
          QHash<int,_QEvdevTouchScreenData::Contact>::removeImpl<int>(&local_48,&local_5c);
          pQVar11 = (QEvdevTouchScreenData *)local_50;
          QHash<int,_QEvdevTouchScreenData::Contact>::erase
                    ((QHash<int,_QEvdevTouchScreenData::Contact> *)pQVar11,it);
          auVar10 = local_50;
          if (iVar12 < local_5c) {
            iVar12 = local_5c;
          }
        }
      }
    } while (auVar10 != (undefined1  [8])0x0);
  }
  bVar3 = true;
  auVar10 = (undefined1  [8])0x0;
LAB_00128302:
  if ((local_48.d != (Data *)0x0) && ((local_48.d)->size != 0)) goto LAB_00128448;
  pQVar11 = (QEvdevTouchScreenData *)0x0;
  pDVar7 = (Data *)0x0;
  if (bVar3) {
LAB_00128388:
    if ((pDVar7 == (Data *)0x0) && (pQVar11 == (QEvdevTouchScreenData *)0x0)) goto LAB_00128448;
  }
  else {
LAB_00128323:
    pQVar11 = (QEvdevTouchScreenData *)auVar10;
    if (1 < *(uint *)&((QEvdevTouchScreenData *)auVar10)->q) {
      local_50 = (undefined1  [8])
                 QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::
                 detached((Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)auVar10)
      ;
      pQVar11 = (QEvdevTouchScreenData *)local_50;
    }
    pSVar1 = (Span *)(pQVar11->m_touchPoints).d.size;
    if (pSVar1->offsets[0] == 0xff) {
      pDVar8 = (Data *)0x1;
      do {
        pDVar7 = pDVar8;
        if ((pQVar11->m_touchPoints).d.d == pDVar7) {
          pQVar11 = (QEvdevTouchScreenData *)0x0;
          pDVar7 = (Data *)0x0;
          break;
        }
        pDVar8 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                                 _M_i + 1);
      } while (pSVar1[(ulong)pDVar7 >> 7].offsets[(uint)pDVar7 & 0x7f] == 0xff);
      goto LAB_00128388;
    }
    pDVar7 = (Data *)0x0;
  }
  do {
    iVar12 = iVar12 + 1;
    pSVar1 = (Span *)(pQVar11->m_touchPoints).d.size;
    uVar6 = (ulong)pDVar7 >> 7;
    uVar9 = (uint)pDVar7 & 0x7f;
    pEVar2 = pSVar1[uVar6].entries;
    *(int *)(pEVar2[pSVar1[uVar6].offsets[uVar9]].storage.data + 4) = iVar12;
    args = (Contact *)(pEVar2[pSVar1[uVar6].offsets[uVar9]].storage.data + 4);
    local_3c = args->trackingId;
    QHash<int,QEvdevTouchScreenData::Contact>::emplace<QEvdevTouchScreenData::Contact_const&>
              ((QHash<int,QEvdevTouchScreenData::Contact> *)&local_58,&local_3c,args);
    do {
      if ((Data *)((long)&(pQVar11->m_touchPoints).d.d[-1].super_QArrayData.alloc + 7U) == pDVar7) {
        pDVar7 = (Data *)0x0;
        pQVar11 = (QEvdevTouchScreenData *)0x0;
        break;
      }
      pDVar7 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                               _M_i + 1);
    } while (((Span *)(pQVar11->m_touchPoints).d.size)[(ulong)pDVar7 >> 7].offsets
             [(uint)pDVar7 & 0x7f] == 0xff);
  } while ((pDVar7 != (Data *)0x0) || (pQVar11 != (QEvdevTouchScreenData *)0x0));
LAB_00128448:
  QHash<int,_QEvdevTouchScreenData::Contact>::operator=(&this->m_contacts,&local_58);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_58);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)local_50);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_48);
  if (*(TouchPoint **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevTouchScreenData::assignIds()
{
    QHash<int, Contact> candidates = m_lastContacts, pending = m_contacts, newContacts;
    int maxId = -1;
    QHash<int, Contact>::iterator it, ite, bestMatch;
    while (!pending.isEmpty() && !candidates.isEmpty()) {
        int bestDist = -1, bestId = 0;
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            int dist;
            int id = findClosestContact(candidates, it->x, it->y, &dist);
            if (id >= 0 && (bestDist == -1 || dist < bestDist)) {
                bestDist = dist;
                bestId = id;
                bestMatch = it;
            }
        }
        if (bestDist >= 0) {
            bestMatch->trackingId = bestId;
            newContacts.insert(bestId, *bestMatch);
            candidates.remove(bestId);
            pending.erase(bestMatch);
            if (bestId > maxId)
                maxId = bestId;
        }
    }
    if (candidates.isEmpty()) {
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            it->trackingId = ++maxId;
            newContacts.insert(it->trackingId, *it);
        }
    }
    m_contacts = newContacts;
}